

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int choice;
  int local_2c;
  
  local_2c = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Welcome! Please choose one of the various algorithms implemented:",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (local_2c != 5) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n",0x30);
      std::istream::operator>>((istream *)&std::cin,&local_2c);
      switch(local_2c) {
      case 1:
        DFS();
        break;
      case 2:
        BFS();
        break;
      case 3:
        BestFirst();
        break;
      case 4:
        Astar();
      }
    } while (local_2c != 5);
  }
  return 0;
}

Assistant:

int main() {
    int choice = 0;
    std::cout << "Welcome! Please choose one of the various algorithms implemented:" << std::endl;
    while (choice != 5) {
        std::cout << "1. DFS \n 2. BFS \n 3. Best First Search \n 4. A* \n";
        std::cin >> choice;
        if (choice == 1) {
            DFS();
        } else if (choice == 2) {
            BFS();
        } else if (choice == 3) {
            BestFirst();
        } else if (choice == 4) {
            Astar();
        }
    }
    return 0;
}